

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMNormalizer::addOrChangeNamespaceDecl
          (DOMNormalizer *this,XMLCh *prefix,XMLCh *uri,DOMElementImpl *element)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLBuffer buf;
  
  bVar1 = XMLString::equals(prefix,L"");
  if (bVar1) {
    (*(element->super_DOMElement).super_DOMNode._vptr_DOMNode[0x31])
              (element,XMLUni::fgXMLNSURIName,XMLUni::fgXMLNSString,uri);
    return;
  }
  buf.fMemoryManager = this->fMemoryManager;
  buf.fIndex = 0;
  buf.fCapacity = 0x3ff;
  buf.fFullSize = 0;
  buf.fUsed = false;
  buf.fFullHandler = (XMLBufferFullHandler *)0x0;
  iVar2 = (*(buf.fMemoryManager)->_vptr_MemoryManager[3])(buf.fMemoryManager,0x800);
  buf.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
  *buf.fBuffer = L'\0';
  XMLBuffer::set(&buf,(XMLCh *)XMLUni::fgXMLNSString);
  XMLBuffer::append(&buf,L':');
  XMLBuffer::append(&buf,prefix);
  buf.fBuffer[buf.fIndex] = L'\0';
  (*(element->super_DOMElement).super_DOMNode._vptr_DOMNode[0x31])
            (element,XMLUni::fgXMLNSURIName,buf.fBuffer,uri);
  XMLBuffer::~XMLBuffer(&buf);
  return;
}

Assistant:

void DOMNormalizer::addOrChangeNamespaceDecl(const XMLCh* prefix, const XMLCh* uri, DOMElementImpl* element) const {

    if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
        element->setAttributeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString, uri);
    } else {
        XMLBuffer buf(1023, fMemoryManager);
        buf.set(XMLUni::fgXMLNSString);
        buf.append(chColon);
        buf.append(prefix);
        element->setAttributeNS(XMLUni::fgXMLNSURIName, buf.getRawBuffer(), uri);
    }
}